

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_sinh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  unkuint10 Var3;
  flag zSign;
  int32_t iVar4;
  float32 a_00;
  uint64_t aSig_00;
  uint16_t uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  floatx80 fVar6;
  floatx80 fVar7;
  floatx80 fVar8;
  floatx80 fVar9;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  float32 fact;
  floatx80 fp2;
  floatx80 fp1;
  floatx80 fp0;
  int32_t compact;
  int8_t user_rnd_prec;
  int8_t user_rnd_mode;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  Var3 = a._0_10_;
  fVar7._10_6_ = 0;
  fVar7.low = (long)Var3;
  fVar7.high = (short)(Var3 >> 0x40);
  aSig_00 = extractFloatx80Frac(fVar7);
  fVar8._10_6_ = 0;
  fVar8.low = (long)Var3;
  fVar8.high = (short)(Var3 >> 0x40);
  iVar4 = extractFloatx80Exp(fVar8);
  a_01._10_6_ = 0;
  a_01.low = (long)Var3;
  a_01.high = (short)(Var3 >> 0x40);
  zSign = extractFloatx80Sign(a_01);
  if (iVar4 == 0x7fff) {
    if ((aSig_00 & 0x7fffffffffffffff) == 0) {
      fVar6 = packFloatx80(zSign,0x7fff,0);
      uVar5 = fVar6.high;
    }
    else {
      a_02._10_6_ = 0;
      a_02.low = (long)Var3;
      a_02.high = (short)(Var3 >> 0x40);
      fVar6 = propagateFloatx80NaNOneArg(a_02,status);
      uVar5 = fVar6.high;
    }
  }
  else if ((iVar4 == 0) && (aSig_00 == 0)) {
    fVar6 = packFloatx80(zSign,0,0);
    uVar5 = fVar6.high;
  }
  else {
    cVar1 = status->float_rounding_mode;
    cVar2 = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    iVar4 = floatx80_make_compact(iVar4,aSig_00);
    if (iVar4 < 0x400cb168) {
      a_08._10_6_ = 0;
      a_08.low = (long)Var3;
      a_08.high = (short)(Var3 >> 0x40);
      fVar7 = floatx80_abs(a_08);
      a_09._10_6_ = 0;
      a_09.low = (long)fVar7._0_10_;
      a_09.high = (short)(fVar7._0_10_ >> 0x40);
      fVar7 = floatx80_etoxm1_m68k(a_09,status);
      fVar8 = float32_to_floatx80_m68k(0x3f800000,status);
      Var3 = fVar7._0_10_;
      a_10._10_6_ = 0;
      a_10.low = (long)Var3;
      a_10.high = (short)(Var3 >> 0x40);
      b_02._10_6_ = 0;
      b_02.low = (long)fVar8._0_10_;
      b_02.high = (short)(fVar8._0_10_ >> 0x40);
      fVar7 = floatx80_add_m68k(a_10,b_02,status);
      a_11._10_6_ = 0;
      a_11.low = (long)Var3;
      a_11.high = (short)(Var3 >> 0x40);
      b_03._10_6_ = 0;
      b_03.low = (long)fVar7._0_10_;
      b_03.high = (short)(fVar7._0_10_ >> 0x40);
      fVar7 = floatx80_div_m68k(a_11,b_03,status);
      a_12._10_6_ = 0;
      a_12.low = (long)fVar7._0_10_;
      a_12.high = (short)(fVar7._0_10_ >> 0x40);
      b_04._10_6_ = 0;
      b_04.low = (long)Var3;
      b_04.high = (short)(Var3 >> 0x40);
      fVar7 = floatx80_add_m68k(a_12,b_04,status);
      a_00 = packFloat32(zSign,0x7e,0);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      fVar8 = float32_to_floatx80_m68k(a_00,status);
      a_13._10_6_ = 0;
      a_13.low = (long)fVar7._0_10_;
      a_13.high = (short)(fVar7._0_10_ >> 0x40);
      b_05._10_6_ = 0;
      b_05.low = (long)fVar8._0_10_;
      b_05.high = (short)(fVar8._0_10_ >> 0x40);
      fVar7 = floatx80_mul_m68k(a_13,b_05,status);
      uVar5 = fVar7.high;
      float_raise_m68k(' ',status);
      fVar6._8_8_ = extraout_RDX_00;
      fVar6.low = fVar7.low;
    }
    else if (iVar4 < 0x400cb2b4) {
      a_03._10_6_ = 0;
      a_03.low = (long)Var3;
      a_03.high = (short)(Var3 >> 0x40);
      fVar7 = floatx80_abs(a_03);
      fVar8 = float64_to_floatx80_m68k(0x40c62d38d3d64634,status);
      a_04._10_6_ = 0;
      a_04.low = (long)fVar7._0_10_;
      a_04.high = (short)(fVar7._0_10_ >> 0x40);
      b._10_6_ = 0;
      b.low = (long)fVar8._0_10_;
      b.high = (short)(fVar8._0_10_ >> 0x40);
      fVar7 = floatx80_sub_m68k(a_04,b,status);
      fVar8 = float64_to_floatx80_m68k(0x3d6f90aeb1e75cc7,status);
      a_05._10_6_ = 0;
      a_05.low = (long)fVar7._0_10_;
      a_05.high = (short)(fVar7._0_10_ >> 0x40);
      b_00._10_6_ = 0;
      b_00.low = (long)fVar8._0_10_;
      b_00.high = (short)(fVar8._0_10_ >> 0x40);
      fVar7 = floatx80_sub_m68k(a_05,b_00,status);
      a_06._10_6_ = 0;
      a_06.low = (long)fVar7._0_10_;
      a_06.high = (short)(fVar7._0_10_ >> 0x40);
      fVar7 = floatx80_etox_m68k(a_06,status);
      fVar8 = packFloatx80(zSign,0x7ffb,0x8000000000000000);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      a_07._10_6_ = 0;
      a_07.low = (long)fVar7._0_10_;
      a_07.high = (short)(fVar7._0_10_ >> 0x40);
      b_01._10_6_ = 0;
      b_01.low = (long)fVar8._0_10_;
      b_01.high = (short)(fVar8._0_10_ >> 0x40);
      fVar7 = floatx80_mul_m68k(a_07,b_01,status);
      uVar5 = fVar7.high;
      float_raise_m68k(' ',status);
      fVar6._8_8_ = extraout_RDX;
      fVar6.low = fVar7.low;
    }
    else {
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      fVar6 = roundAndPackFloatx80_m68k
                        (status->floatx80_rounding_precision,zSign,0x8000,aSig_00,0,status);
      uVar5 = fVar6.high;
    }
  }
  a_local._8_8_ = fVar6.low;
  fVar9._10_6_ = fVar6._10_6_;
  fVar9.high = uVar5;
  fVar9.low = a_local._8_8_;
  return fVar9;
}

Assistant:

floatx80 floatx80_sinh(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1, fp2;
    float32 fact;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        return packFloatx80(aSign, floatx80_infinity.high,
                            floatx80_infinity.low);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact > 0x400CB167) {
        /* SINHBIG */
        if (compact > 0x400CB2B3) {
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                        aSign, 0x8000, aSig, 0, status);
        } else {
            fp0 = floatx80_abs(a); /* Y = |X| */
            fp0 = floatx80_sub(fp0, float64_to_floatx80(
                               make_float64(0x40C62D38D3D64634), status),
                               status); /* (|X|-16381LOG2_LEAD) */
            fp0 = floatx80_sub(fp0, float64_to_floatx80(
                               make_float64(0x3D6F90AEB1E75CC7), status),
                               status); /* |X| - 16381 LOG2, ACCURATE */
            fp0 = floatx80_etox(fp0, status);
            fp2 = packFloatx80(aSign, 0x7FFB, one_sig);

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_mul(fp0, fp2, status);

            float_raise(float_flag_inexact, status);

            return a;
        }
    } else { /* |X| < 16380 LOG2 */
        fp0 = floatx80_abs(a); /* Y = |X| */
        fp0 = floatx80_etoxm1(fp0, status); /* FP0 IS Z = EXPM1(Y) */
        fp1 = floatx80_add(fp0, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* 1+Z */
        fp2 = fp0;
        fp0 = floatx80_div(fp0, fp1, status); /* Z/(1+Z) */
        fp0 = floatx80_add(fp0, fp2, status);

        fact = packFloat32(aSign, 0x7E, 0);

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_mul(fp0, float32_to_floatx80(fact, status), status);

        float_raise(float_flag_inexact, status);

        return a;
    }
}